

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::RepeatedPrimitiveFieldGenerator::GenerateSerializeWithCachedSizes
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (this->$name$_size() > 0) {\n  ::google::protobuf::internal::WireFormatLite::WriteTag($number$, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);\n  output->WriteVarint32(_$name$_cached_byte_size_);\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,"for (int i = 0; i < this->$name$_size(); i++) {\n");
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar2);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$NoTag(\n    this->$name$(i), output);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$(\n    $number$, this->$name$(i), output);\n"
                      );
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  ::google::protobuf::internal::WireFormatLite::WriteTag("
          "$number$, "
          "::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, "
          "output);\n"
      "  output->WriteVarint32(_$name$_cached_byte_size_);\n"
      "}\n");
  }
  printer->Print(variables_,
      "for (int i = 0; i < this->$name$_size(); i++) {\n");
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$NoTag(\n"
      "    this->$name$(i), output);\n");
  } else {
    printer->Print(variables_,
      "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$(\n"
      "    $number$, this->$name$(i), output);\n");
  }
  printer->Print("}\n");
}